

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_icon2.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  char *format;
  int iVar6;
  double dVar7;
  double dVar8;
  ALLEGRO_BITMAP *icons [2];
  ALLEGRO_EVENT event;
  
  cVar1 = al_install_system(0x85020700,atexit);
  if (cVar1 == '\0') {
    format = "Could not init Allegro.\n";
  }
  else {
    al_install_keyboard();
    al_init_image_addon();
    icons[0] = (ALLEGRO_BITMAP *)al_load_bitmap("data/cursor.tga");
    if (icons[0] == (ALLEGRO_BITMAP *)0x0) {
      format = "icons.tga not found\n";
    }
    else {
      al_x_set_initial_icon(icons[0]);
      lVar2 = al_create_display(0x140,200);
      if (lVar2 != 0) {
        al_map_rgb_f(0,0,0);
        al_clear_to_color();
        al_flip_display();
        al_set_new_bitmap_flags(1);
        icons[1] = (ALLEGRO_BITMAP *)al_create_bitmap(0x20,0x20);
        al_set_target_bitmap(icons[1]);
        dVar7 = 0.0;
        for (iVar5 = 0; iVar5 != 0x20; iVar5 = iVar5 + 1) {
          dVar8 = 0.0;
          for (iVar6 = 0; iVar6 != 0x20; iVar6 = iVar6 + 1) {
            al_map_rgb_f(CONCAT44((int)((ulong)(dVar8 / 31.0) >> 0x20),(float)(dVar8 / 31.0)),
                         (float)(dVar7 / 31.0),0x3f800000);
            al_put_pixel(iVar6,iVar5);
            dVar8 = dVar8 + 1.0;
          }
          dVar7 = dVar7 + 1.0;
        }
        al_set_target_backbuffer(lVar2);
        al_set_display_icons(lVar2,2,icons);
        uVar3 = al_create_event_queue();
        uVar4 = al_get_keyboard_event_source();
        al_register_event_source(uVar3,uVar4);
        uVar4 = al_get_display_event_source(lVar2);
        al_register_event_source(uVar3,uVar4);
        do {
          al_wait_for_event(uVar3,&event);
          if (event.type == 0x2a) break;
        } while (event.display.width != 0x3b || event.type != 10);
        al_uninstall_system();
        return 0;
      }
      format = "Error creating display\n";
    }
  }
  abort_example(format);
  iVar5 = __cxa_atexit();
  return iVar5;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_BITMAP *icons[NUM_ICONS];
   ALLEGRO_EVENT_QUEUE *queue;
   int u, v;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   al_install_keyboard();
   al_init_image_addon();
   init_platform_specific();

   /* First icon 16x16: Read from file. */
   icons[0] = al_load_bitmap("data/cursor.tga");
   if (!icons[0]) {
      abort_example("icons.tga not found\n");
   }

#if defined(ALLEGRO_UNIX) && !defined(ALLEGRO_RASPBERRYPI)
   al_x_set_initial_icon(icons[0]);
#endif

   display = al_create_display(320, 200);
   if (!display) {
      abort_example("Error creating display\n");
   }
   al_clear_to_color(al_map_rgb_f(0, 0, 0));
   al_flip_display();

   /* Second icon 32x32: Create it. */
   al_set_new_bitmap_flags(ALLEGRO_MEMORY_BITMAP);
   icons[1] = al_create_bitmap(32, 32);
   al_set_target_bitmap(icons[1]);
   for (v = 0; v < 32; v++) {
      for (u = 0; u < 32; u++) {
         al_put_pixel(u, v, al_map_rgb_f(u / 31.0, v / 31.0, 1));
      }
   }
   al_set_target_backbuffer(display);

   al_set_display_icons(display, NUM_ICONS, icons);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_display_event_source(display));

   for (;;) {
      ALLEGRO_EVENT event;
      al_wait_for_event(queue, &event);

      if (event.type == ALLEGRO_EVENT_KEY_DOWN &&
            event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
         break;
      }
      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
   }

   al_uninstall_system();

   return 0;
}